

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O1

Hash __thiscall
Fossilize::ApplicationInfoFilter::Impl::get_bucket_hash
          (Impl *this,VkPhysicalDeviceProperties2 *props,VkApplicationInfo *info,void *device_pnext)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
  *this_00;
  VariantDependency *pVVar1;
  bool bVar2;
  iterator iVar3;
  VariantDependency *dep;
  VariantDependency *pVVar4;
  VariantDependency *dep_5;
  allocator local_69;
  Hasher local_68;
  Impl *local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_58;
  key_type local_50;
  
  local_68.h = 0xaf63bd4c8601b7df;
  bVar2 = true;
  local_60 = this;
  if ((info != (VkApplicationInfo *)0x0) && (info->pApplicationName != (char *)0x0)) {
    std::__cxx11::string::string((string *)&local_50,info->pApplicationName,&local_69);
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->application_infos)._M_h,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
        ._M_cur != (__node_type *)0x0) {
      pVVar4 = *(VariantDependency **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                       ._M_cur + 0x50);
      pVVar1 = *(VariantDependency **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                       ._M_cur + 0x58);
      local_58 = iVar3.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                 ._M_cur;
      if (pVVar4 != pVVar1) {
        do {
          hash_variant(&local_68,*pVVar4,props,info,device_pnext,false);
          pVVar4 = pVVar4 + 1;
        } while (pVVar4 != pVVar1);
      }
      pVVar4 = *(VariantDependency **)
                ((long)&((local_58._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
                        ._M_storage._M_storage + 0x60);
      pVVar1 = *(VariantDependency **)
                ((long)&((local_58._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
                        ._M_storage._M_storage + 0x68);
      if (pVVar4 != pVVar1) {
        do {
          hash_variant(&local_68,*pVVar4,props,info,device_pnext,true);
          pVVar4 = pVVar4 + 1;
        } while (pVVar4 != pVVar1);
      }
      bVar2 = false;
    }
  }
  local_68.h = local_68.h * 0x100000001b3;
  if ((info != (VkApplicationInfo *)0x0) && (info->pEngineName != (char *)0x0)) {
    this_00 = &local_60->engine_infos;
    std::__cxx11::string::string((string *)&local_50,info->pEngineName,&local_69);
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_00->_M_h,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
        ._M_cur != (__node_type *)0x0) {
      pVVar4 = *(VariantDependency **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                       ._M_cur + 0x50);
      pVVar1 = *(VariantDependency **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                       ._M_cur + 0x58);
      local_58 = iVar3.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                 ._M_cur;
      if (pVVar4 != pVVar1) {
        do {
          hash_variant(&local_68,*pVVar4,props,info,device_pnext,false);
          pVVar4 = pVVar4 + 1;
        } while (pVVar4 != pVVar1);
      }
      pVVar4 = *(VariantDependency **)
                ((long)&((local_58._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
                        ._M_storage._M_storage + 0x60);
      pVVar1 = *(VariantDependency **)
                ((long)&((local_58._M_cur)->
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
                        ._M_storage._M_storage + 0x68);
      if (pVVar4 != pVVar1) {
        do {
          hash_variant(&local_68,*pVVar4,props,info,device_pnext,true);
          pVVar4 = pVVar4 + 1;
        } while (pVVar4 != pVVar1);
      }
      bVar2 = false;
    }
  }
  if (bVar2) {
    pVVar4 = (local_60->default_variant_dependencies).
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar1 = (local_60->default_variant_dependencies).
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar4 != pVVar1) {
      do {
        hash_variant(&local_68,*pVVar4,props,info,device_pnext,false);
        pVVar4 = pVVar4 + 1;
      } while (pVVar4 != pVVar1);
    }
    pVVar4 = (local_60->default_variant_dependencies_feature).
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar1 = (local_60->default_variant_dependencies_feature).
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar4 != pVVar1) {
      do {
        hash_variant(&local_68,*pVVar4,props,info,device_pnext,true);
        pVVar4 = pVVar4 + 1;
      } while (pVVar4 != pVVar1);
    }
  }
  return local_68.h;
}

Assistant:

Hash ApplicationInfoFilter::Impl::get_bucket_hash(const VkPhysicalDeviceProperties2 *props,
                                                  const VkApplicationInfo *info,
                                                  const void *device_pnext)
{
	Hasher h;
	bool use_default_variant = true;

	h.u32(0);
	if (info && info->pApplicationName)
	{
		auto itr = application_infos.find(info->pApplicationName);
		if (itr != application_infos.end())
		{
			use_default_variant = false;
			for (auto &dep : itr->second.variant_dependencies)
				hash_variant(h, dep, props, info, device_pnext, false);
			for (auto &dep : itr->second.variant_dependencies_feature)
				hash_variant(h, dep, props, info, device_pnext, true);
		}
	}

	h.u32(0);
	if (info && info->pEngineName)
	{
		auto itr = engine_infos.find(info->pEngineName);
		if (itr != engine_infos.end())
		{
			use_default_variant = false;
			for (auto &dep : itr->second.variant_dependencies)
				hash_variant(h, dep, props, info, device_pnext, false);
			for (auto &dep : itr->second.variant_dependencies_feature)
				hash_variant(h, dep, props, info, device_pnext, true);
		}
	}

	if (use_default_variant)
	{
		for (auto &dep : default_variant_dependencies)
			hash_variant(h, dep, props, info, device_pnext, false);
		for (auto &dep : default_variant_dependencies_feature)
			hash_variant(h, dep, props, info, device_pnext, true);
	}

	return h.get();
}